

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::forward_relaxed_precision
          (CompilerGLSL *this,uint32_t dst_id,uint32_t *args,uint32_t length)

{
  Precision PVar1;
  
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    PVar1 = analyze_expression_precision(this,args,length);
    if (PVar1 == Mediump) {
      Compiler::set_decoration(&this->super_Compiler,(ID)dst_id,DecorationRelaxedPrecision,0);
      return;
    }
  }
  return;
}

Assistant:

void CompilerGLSL::forward_relaxed_precision(uint32_t dst_id, const uint32_t *args, uint32_t length)
{
	// Only GLSL supports RelaxedPrecision directly.
	// We cannot implement this in HLSL or MSL because it is tied to the type system.
	// In SPIR-V, everything must masquerade as 32-bit.
	if (!backend.requires_relaxed_precision_analysis)
		return;

	auto input_precision = analyze_expression_precision(args, length);

	// For expressions which are loaded or directly forwarded, we inherit mediump implicitly.
	// For dst_id to be analyzed properly, it must inherit any relaxed precision decoration from src_id.
	if (input_precision == Options::Mediump)
		set_decoration(dst_id, DecorationRelaxedPrecision);
}